

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::calcSizeHints(QFormLayoutPrivate *this)

{
  QLayoutStruct *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = -0x55555556;
  local_40 = -0x55555556;
  local_44 = -0x55555556;
  local_48 = -0x55555556;
  QLayout::getContentsMargins
            (*(QLayout **)&(this->super_QLayoutPrivate).field_0x8,&local_3c,&local_40,&local_44,
             &local_48);
  updateSizes(this);
  setupVerticalLayoutData(this,0x7ffff);
  iVar2 = local_48 + local_40;
  iVar5 = iVar2;
  if (0 < (long)this->vLayoutCount) {
    pQVar1 = (this->vLayouts).d.ptr;
    lVar6 = 0;
    do {
      iVar3 = *(int *)((long)&pQVar1->spacing + lVar6);
      iVar2 = iVar2 + iVar3 + *(int *)((long)&pQVar1->sizeHint + lVar6);
      iVar5 = iVar5 + iVar3 + *(int *)((long)&pQVar1->minimumSize + lVar6);
      lVar6 = lVar6 + 0x20;
    } while ((long)this->vLayoutCount * 0x20 != lVar6);
  }
  iVar4 = this->min_width + local_44 + local_3c;
  iVar3 = local_44 + local_3c + this->sh_width;
  if (0x7fffe < iVar4) {
    iVar4 = 0x7ffff;
  }
  (this->minSize).wd.m_i = iVar4;
  if (0x7fffe < iVar5) {
    iVar5 = 0x7ffff;
  }
  (this->minSize).ht.m_i = iVar5;
  if (0x7fffe < iVar3) {
    iVar3 = 0x7ffff;
  }
  (this->prefSize).wd.m_i = iVar3;
  iVar5 = 0x7ffff;
  if (iVar2 < 0x7ffff) {
    iVar5 = iVar2;
  }
  (this->prefSize).ht.m_i = iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayoutPrivate::calcSizeHints()
{
    Q_Q(QFormLayout);

    int leftMargin, topMargin, rightMargin, bottomMargin;
    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    updateSizes();
    setupVerticalLayoutData(QLAYOUTSIZE_MAX);
    // Don't need to call setupHorizontal here

    int h = topMargin + bottomMargin;
    int mh = topMargin + bottomMargin;

    // The following are set in updateSizes
    int w = sh_width + leftMargin + rightMargin;
    int mw = min_width + leftMargin + rightMargin;

    for (int i = 0; i < vLayoutCount; ++i) {
        int spacing = vLayouts.at(i).spacing;
        h += vLayouts.at(i).sizeHint + spacing;
        mh += vLayouts.at(i).minimumSize + spacing;
    }

    minSize.rwidth() = qMin(mw, QLAYOUTSIZE_MAX);
    minSize.rheight() = qMin(mh, QLAYOUTSIZE_MAX);
    prefSize.rwidth() = qMin(w, QLAYOUTSIZE_MAX);
    prefSize.rheight() = qMin(h, QLAYOUTSIZE_MAX);
}